

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O0

void address_space_stl_notdirty_cached_slow_tricore
               (uc_struct_conflict15 *uc,MemoryRegionCache *cache,hwaddr addr,uint32_t val,
               MemTxAttrs attrs,MemTxResult *result)

{
  _Bool _Var1;
  MemTxResult local_5c;
  _Bool release_lock;
  ram_addr_t rStack_58;
  MemTxResult r;
  hwaddr addr1;
  hwaddr l;
  MemoryRegion_conflict *mr;
  uint8_t *ptr;
  MemTxResult *result_local;
  hwaddr hStack_28;
  uint32_t val_local;
  hwaddr addr_local;
  MemoryRegionCache *cache_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  addr1 = 4;
  ptr = (uint8_t *)result;
  result_local._4_4_ = val;
  hStack_28 = addr;
  addr_local = (hwaddr)cache;
  cache_local = (MemoryRegionCache *)uc;
  uc_local._4_4_ = attrs;
  l = (hwaddr)address_space_translate_cached(cache,addr,&stack0xffffffffffffffa8,&addr1,true,attrs);
  if (3 < addr1) {
    _Var1 = memory_access_is_direct((MemoryRegion_conflict *)l,true);
    if (_Var1) {
      mr = (MemoryRegion_conflict *)
           qemu_map_ram_ptr_tricore
                     (*(uc_struct_conflict15 **)(l + 0x80),*(RAMBlock **)(l + 8),rStack_58);
      stl_le_p(mr,result_local._4_4_);
      local_5c = 0;
      goto LAB_012abb82;
    }
  }
  prepare_mmio_access((MemoryRegion_conflict *)l);
  local_5c = memory_region_dispatch_write_tricore
                       ((uc_struct_conflict15 *)cache_local,(MemoryRegion_conflict *)l,rStack_58,
                        (ulong)result_local._4_4_,MO_32,uc_local._4_4_);
LAB_012abb82:
  if (ptr != (uint8_t *)0x0) {
    *(MemTxResult *)ptr = local_5c;
  }
  return;
}

Assistant:

void glue(address_space_stl_notdirty, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 4;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (l < 4 || !memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);

        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_32, attrs);
    } else {
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stl_p(ptr, val);

        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}